

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentPlanner.cpp
# Opt level: O1

vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> * __thiscall
multi_agent_planning::MultiAgentPlanner::solve_best_alternative
          (vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
           *__return_storage_ptr__,MultiAgentPlanner *this,
          vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
          *agents,vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                  *instances,Scenario *scenario,int theta)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  pointer pPVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  pointer __x;
  pointer pPVar10;
  int iVar11;
  Plan *this_00;
  int iVar12;
  long lVar13;
  vector<int,_std::allocator<int>_> alternativeCosts;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> alternativePlans;
  vector<int,_std::allocator<int>_> costs;
  Plan plan;
  vector<int,_std::allocator<int>_> local_e8;
  Scenario *local_d0;
  string local_c8;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> local_a8;
  vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_> *local_90;
  vector<int,_std::allocator<int>_> local_88;
  Plan local_70;
  Plan local_50;
  
  local_90 = instances;
  solve_baseline(__return_storage_ptr__,this,agents,instances);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_88,
             (long)(agents->
                   super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(agents->
                   super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_70);
  local_d0 = scenario;
  if ((agents->
      super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (agents->
      super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    uVar7 = 0;
    do {
      pPVar5 = (__return_storage_ptr__->
               super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
               )._M_impl.super__Vector_impl_data._M_start;
      this_00 = &local_50;
      std::
      vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
      ::vector(&local_50.actions,
               (vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                *)((long)&(pPVar5->actions).
                          super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                          ._M_impl + lVar4));
      scenario = local_d0;
      local_50.cost = *(float *)((long)&pPVar5->cost + lVar4);
      iVar2 = evaluate_one_plan((MultiAgentPlanner *)this_00,__return_storage_ptr__,local_d0,
                                &local_50,(int)uVar7);
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar7] = iVar2;
      if (local_50.actions.
          super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.actions.
                        super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar7 = uVar7 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar7 < (ulong)((long)(agents->
                                   super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(agents->
                                   super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  if (1 < theta) {
    iVar2 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"!!!!!!!!!!!! Iteration ",0x17);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," !!!!!!!!!!!!",0xd);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_a8.
      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      pPVar10 = (agents->
                super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((agents->
          super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
          )._M_impl.super__Vector_impl_data._M_finish == pPVar10) {
        uVar7 = 0;
      }
      else {
        lVar4 = 0;
        lVar13 = 0;
        uVar8 = 0;
        do {
          PlanningAgent::computeInterDependentPlan
                    (&local_70,(PlanningAgent *)((long)&pPVar10->agent_id + lVar13),
                     (Instance *)
                     ((long)&((local_90->
                              super__Vector_base<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                              )._M_impl.super__Vector_impl_data._M_start)->start + lVar4),scenario,
                     __return_storage_ptr__,1.0);
          std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
          push_back(&local_a8,&local_70);
          PlanningAgent::planToString_abi_cxx11_
                    (&local_c8,
                     (PlanningAgent *)
                     ((long)&((agents->
                              super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                              )._M_impl.super__Vector_impl_data._M_start)->agent_id + lVar13),
                     &local_70);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     (char *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,(int)local_c8._M_dataplus._M_p
                                     ),local_c8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,(int)local_c8._M_dataplus._M_p) !=
              &local_c8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_c8._M_dataplus._M_p._4_4_,(int)local_c8._M_dataplus._M_p)
                           );
          }
          local_c8._M_dataplus._M_p._0_4_ = (int)local_70.cost;
          if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_e8,
                       (iterator)
                       local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_c8);
          }
          else {
            *local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = (int)local_c8._M_dataplus._M_p;
            local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if (local_70.actions.
              super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70.actions.
                            super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          uVar8 = uVar8 + 1;
          pPVar10 = (agents->
                    super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar7 = (long)(agents->
                        super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar10 >> 6;
          lVar13 = lVar13 + 0x40;
          lVar4 = lVar4 + 0x10;
        } while (uVar8 < uVar7);
      }
      if (uVar7 == 0) {
        iVar6 = 0;
        bVar1 = true;
      }
      else {
        bVar1 = true;
        uVar8 = 0;
        iVar11 = 0;
        uVar9 = 0;
        do {
          iVar12 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8] -
                   local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
          if (0 < iVar12) {
            bVar1 = false;
          }
          if (iVar11 < iVar12) {
            uVar9 = uVar8 & 0xffffffff;
          }
          iVar6 = (int)uVar9;
          if (iVar11 < iVar12) {
            iVar11 = iVar12;
          }
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Agent ",6);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," wins!",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      __x = local_a8.
            super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
            ._M_impl.super__Vector_impl_data._M_start + iVar6;
      pPVar5 = (__return_storage_ptr__->
               super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
               )._M_impl.super__Vector_impl_data._M_start + iVar6;
      std::
      vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
      ::operator=(&pPVar5->actions,&__x->actions);
      pPVar5->cost = __x->cost;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar6] =
           local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar6];
      if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar2 = iVar2 + 1;
      std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::~vector
                (&local_a8);
      scenario = local_d0;
    } while (!bVar1 && iVar2 < theta);
  }
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Plan> MultiAgentPlanner::solve_best_alternative(std::vector<PlanningAgent>& agents, 
																											const std::vector<Instance>& instances, 
																											const Scenario& scenario,
																											const int theta) {
	
	vector<Plan> plans = solve_baseline(agents, instances);

	vector<int> costs(agents.size());
	for (int id = 0; id < agents.size(); ++id) {
		costs[id] = evaluate_one_plan(plans, scenario, plans[id], id);
	}

	int iteration_counter = 1;
	bool convergence = false;

	while ((! convergence) && (iteration_counter < theta)) {
		cout << "!!!!!!!!!!!! Iteration " << iteration_counter << " !!!!!!!!!!!!" << endl;

		vector<Plan> alternativePlans;
		vector<int> alternativeCosts;

		for (int i = 0; i < agents.size(); ++i) {
			Plan plan = agents[i].computeInterDependentPlan(instances[i], scenario, plans);

			alternativePlans.push_back(plan);

			cout << agents[i].planToString(plan);

			alternativeCosts.push_back(plan.cost);

			//int alt_plan_cost = evaluate_one_plan(plans, scenario, plan, i);
			
			//alternativeCosts.push_back(alt_plan_cost);

			//cout << "Inter-dependent plan cost: " << alt_plan_cost << endl;
		}

		int best_alt = 0;
		int best_diff = 0;
		convergence = true;
		
		for (int i = 0; i < agents.size(); ++i) {
			int cost_diff = costs[i] - alternativeCosts[i];

			if (cost_diff > 0) {
				convergence = false;
			}
			
			if (cost_diff > best_diff) {
				best_diff = cost_diff;
				best_alt = i;
			}
		}

		if (! convergence) {
			cout << "Agent " << best_alt << " wins!" << endl;
		}

		plans[best_alt] = alternativePlans[best_alt];
		costs[best_alt] = alternativeCosts[best_alt];

		iteration_counter++;

	}

	return plans;
}